

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_property(nk_context *ctx,char *name,nk_property_variant *variant,float inc_per_pixel,
                nk_property_filter filter)

{
  nk_hash seed;
  nk_window *pnVar1;
  nk_panel *pnVar2;
  nk_widget_layout_states nVar3;
  int iVar4;
  nk_context *local_138;
  int local_11c [2];
  int dummy_select_end;
  int dummy_select_begin;
  int dummy_cursor;
  int dummy_length;
  int dummy_state;
  char dummy_buffer [64];
  int *piStack_c0;
  int old_state;
  int *select_end;
  int *select_begin;
  int *cursor;
  int *len;
  char *buffer;
  int *piStack_90;
  nk_hash hash;
  int *state;
  undefined1 auStack_80 [4];
  nk_widget_layout_states s;
  nk_rect bounds;
  nk_style *style;
  nk_input *in;
  nk_panel *layout;
  nk_window *win;
  nk_property_filter filter_local;
  float inc_per_pixel_local;
  nk_property_variant *variant_local;
  char *name_local;
  nk_context *ctx_local;
  
  dummy_cursor = 0;
  dummy_select_begin = 0;
  dummy_select_end = 0;
  local_11c[1] = 0;
  local_11c[0] = 0;
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x5c53,
                  "void nk_property(struct nk_context *, const char *, struct nk_property_variant *, float, const enum nk_property_filter)"
                 );
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x5c54,
                  "void nk_property(struct nk_context *, const char *, struct nk_property_variant *, float, const enum nk_property_filter)"
                 );
  }
  if (ctx->current->layout == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x5c55,
                  "void nk_property(struct nk_context *, const char *, struct nk_property_variant *, float, const enum nk_property_filter)"
                 );
  }
  if (((ctx != (nk_context *)0x0) && (ctx->current != (nk_window *)0x0)) &&
     (ctx->current->layout != (nk_panel *)0x0)) {
    pnVar1 = ctx->current;
    pnVar2 = pnVar1->layout;
    bounds._8_8_ = &ctx->style;
    nVar3 = nk_widget((nk_rect *)auStack_80,ctx);
    if (nVar3 != NK_WIDGET_INVALID) {
      if (*name == '#') {
        iVar4 = nk_strlen(name);
        seed = (pnVar1->property).seq;
        (pnVar1->property).seq = seed + 1;
        buffer._4_4_ = nk_murmur_hash(name,iVar4,seed);
        variant_local = (nk_property_variant *)(name + 1);
      }
      else {
        iVar4 = nk_strlen(name);
        buffer._4_4_ = nk_murmur_hash(name,iVar4,0x2a);
        variant_local = (nk_property_variant *)name;
      }
      if (((pnVar1->property).active == 0) || (buffer._4_4_ != (pnVar1->property).name)) {
        len = &dummy_length;
        cursor = &dummy_select_begin;
        select_begin = &dummy_select_end;
        piStack_90 = &dummy_cursor;
        select_end = local_11c + 1;
        piStack_c0 = local_11c;
      }
      else {
        len = (int *)(pnVar1->property).buffer;
        cursor = &(pnVar1->property).length;
        select_begin = &(pnVar1->property).cursor;
        piStack_90 = &(pnVar1->property).state;
        select_end = &(pnVar1->property).select_start;
        piStack_c0 = &(pnVar1->property).select_end;
      }
      dummy_buffer._60_4_ = *piStack_90;
      (ctx->text_edit).clip.userdata = (ctx->clip).userdata;
      (ctx->text_edit).clip.paste = (ctx->clip).paste;
      (ctx->text_edit).clip.copy = (ctx->clip).copy;
      if (((nVar3 == NK_WIDGET_ROM) && ((pnVar1->property).active == 0)) ||
         (local_138 = ctx, (pnVar2->flags & 0x1000) != 0)) {
        local_138 = (nk_context *)0x0;
      }
      nk_do_property(&ctx->last_widget_state,&pnVar1->buffer,_auStack_80,(char *)variant_local,
                     variant,inc_per_pixel,(char *)len,cursor,piStack_90,select_begin,select_end,
                     piStack_c0,(nk_style_property *)(bounds._8_8_ + 0x8e8),filter,&local_138->input
                     ,*(nk_user_font **)bounds._8_8_,&ctx->text_edit,ctx->button_behavior);
      if (((local_138 != (nk_context *)0x0) && (*piStack_90 != 0)) &&
         ((pnVar1->property).active == 0)) {
        (pnVar1->property).active = 1;
        nk_memcopy((pnVar1->property).buffer,len,(long)*cursor);
        (pnVar1->property).length = *cursor;
        (pnVar1->property).cursor = *select_begin;
        (pnVar1->property).state = *piStack_90;
        (pnVar1->property).name = buffer._4_4_;
        (pnVar1->property).select_start = *select_end;
        (pnVar1->property).select_end = *piStack_c0;
        if (*piStack_90 == 2) {
          (ctx->input).mouse.grab = '\x01';
          (ctx->input).mouse.grabbed = '\x01';
        }
      }
      if ((*piStack_90 == 0) && (dummy_buffer._60_4_ != 0)) {
        if (dummy_buffer._60_4_ == 2) {
          (ctx->input).mouse.grab = '\0';
          (ctx->input).mouse.grabbed = '\0';
          (ctx->input).mouse.ungrab = '\x01';
        }
        (pnVar1->property).select_start = 0;
        (pnVar1->property).select_end = 0;
        (pnVar1->property).active = 0;
      }
    }
  }
  return;
}

Assistant:

NK_LIB void
nk_property(struct nk_context *ctx, const char *name, struct nk_property_variant *variant,
    float inc_per_pixel, const enum nk_property_filter filter)
{
    struct nk_window *win;
    struct nk_panel *layout;
    struct nk_input *in;
    const struct nk_style *style;

    struct nk_rect bounds;
    enum nk_widget_layout_states s;

    int *state = 0;
    nk_hash hash = 0;
    char *buffer = 0;
    int *len = 0;
    int *cursor = 0;
    int *select_begin = 0;
    int *select_end = 0;
    int old_state;

    char dummy_buffer[NK_MAX_NUMBER_BUFFER];
    int dummy_state = NK_PROPERTY_DEFAULT;
    int dummy_length = 0;
    int dummy_cursor = 0;
    int dummy_select_begin = 0;
    int dummy_select_end = 0;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return;

    win = ctx->current;
    layout = win->layout;
    style = &ctx->style;
    s = nk_widget(&bounds, ctx);
    if (!s) return;

    /* calculate hash from name */
    if (name[0] == '#') {
        hash = nk_murmur_hash(name, (int)nk_strlen(name), win->property.seq++);
        name++; /* special number hash */
    } else hash = nk_murmur_hash(name, (int)nk_strlen(name), 42);

    /* check if property is currently hot item */
    if (win->property.active && hash == win->property.name) {
        buffer = win->property.buffer;
        len = &win->property.length;
        cursor = &win->property.cursor;
        state = &win->property.state;
        select_begin = &win->property.select_start;
        select_end = &win->property.select_end;
    } else {
        buffer = dummy_buffer;
        len = &dummy_length;
        cursor = &dummy_cursor;
        state = &dummy_state;
        select_begin =  &dummy_select_begin;
        select_end = &dummy_select_end;
    }

    /* execute property widget */
    old_state = *state;
    ctx->text_edit.clip = ctx->clip;
    in = ((s == NK_WIDGET_ROM && !win->property.active) ||
        layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
    nk_do_property(&ctx->last_widget_state, &win->buffer, bounds, name,
        variant, inc_per_pixel, buffer, len, state, cursor, select_begin,
        select_end, &style->property, filter, in, style->font, &ctx->text_edit,
        ctx->button_behavior);

    if (in && *state != NK_PROPERTY_DEFAULT && !win->property.active) {
        /* current property is now hot */
        win->property.active = 1;
        NK_MEMCPY(win->property.buffer, buffer, (nk_size)*len);
        win->property.length = *len;
        win->property.cursor = *cursor;
        win->property.state = *state;
        win->property.name = hash;
        win->property.select_start = *select_begin;
        win->property.select_end = *select_end;
        if (*state == NK_PROPERTY_DRAG) {
            ctx->input.mouse.grab = nk_true;
            ctx->input.mouse.grabbed = nk_true;
        }
    }
    /* check if previously active property is now inactive */
    if (*state == NK_PROPERTY_DEFAULT && old_state != NK_PROPERTY_DEFAULT) {
        if (old_state == NK_PROPERTY_DRAG) {
            ctx->input.mouse.grab = nk_false;
            ctx->input.mouse.grabbed = nk_false;
            ctx->input.mouse.ungrab = nk_true;
        }
        win->property.select_start = 0;
        win->property.select_end = 0;
        win->property.active = 0;
    }
}